

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outrec)

{
  bool bVar1;
  code cVar2;
  OutPt *pOVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  OutPt *pOVar11;
  OutPt *pOVar12;
  OutPt *pOVar13;
  bool bVar14;
  IntPoint pt2;
  IntPoint pt1;
  IntPoint pt3;
  OutPt *local_50;
  Clipper *local_48;
  long local_40;
  OutPt *local_38;
  
  outrec->BottomPt = (OutPt *)0x0;
  pOVar13 = outrec->Pts;
  pOVar11 = pOVar13->Prev;
  if (pOVar11 != pOVar13) {
    bVar1 = this->m_StrictSimple;
    cVar2 = (this->_vptr_Clipper[-3] + 0x10)
            [(long)&(this->m_IntersectList).
                    super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ];
    pOVar12 = (OutPt *)0x0;
    local_50 = pOVar13;
    local_48 = this;
    do {
      pOVar3 = pOVar13->Next;
      if (pOVar11 == pOVar3) break;
      lVar4 = (pOVar13->Pt).X;
      lVar5 = (pOVar13->Pt).Y;
      lVar6 = (pOVar3->Pt).X;
      if (((lVar4 == lVar6) && (lVar5 == (pOVar3->Pt).Y)) ||
         ((lVar7 = (pOVar11->Pt).X, lVar4 == lVar7 && (lVar5 == (pOVar11->Pt).Y)))) {
LAB_002db4a7:
        pOVar11->Next = pOVar3;
        pOVar13->Next->Prev = pOVar11;
        pOVar3 = pOVar13->Prev;
        if (pOVar13 != (OutPt *)0x0) {
          operator_delete(pOVar13,0x28);
        }
        pOVar12 = (OutPt *)0x0;
      }
      else {
        lVar5 = (pOVar11->Pt).Y;
        lVar8 = (pOVar13->Pt).Y;
        lVar9 = (pOVar3->Pt).Y;
        pt2.Y = lVar8;
        pt2.X = lVar4;
        pt1.Y = lVar5;
        pt1.X = lVar7;
        pt3.Y = lVar9;
        pt3.X = lVar6;
        local_40 = lVar7;
        local_38 = pOVar12;
        bVar10 = SlopesEqual(pt1,pt2,pt3,
                             (bool)(local_48->_vptr_Clipper[-3] + 8)
                                   [(long)&(local_48->m_GhostJoins).
                                           super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                   ]);
        if (bVar10) {
          if (((bVar1 | (byte)cVar2) & 1) != 0) {
            if (((lVar5 != lVar9 || local_40 != lVar6) && (lVar5 != lVar8 || lVar4 != local_40)) &&
               (lVar9 != lVar8 || lVar4 != lVar6)) {
              if (local_40 == lVar6) {
                bVar10 = lVar5 < lVar8;
                bVar14 = SBORROW8(lVar8,lVar9);
                lVar8 = lVar8 - lVar9;
              }
              else {
                bVar10 = local_40 < lVar4;
                bVar14 = SBORROW8(lVar4,lVar6);
                lVar8 = lVar4 - lVar6;
              }
              if ((bool)(bVar14 == lVar8 < 0 ^ bVar10)) goto LAB_002db5c6;
            }
          }
          goto LAB_002db4a7;
        }
LAB_002db5c6:
        if (pOVar13 == local_38) goto LAB_002db5ea;
        pOVar12 = local_38;
        if (local_38 == (OutPt *)0x0) {
          pOVar12 = pOVar13;
        }
      }
      pOVar13 = pOVar3;
      pOVar11 = pOVar13->Prev;
    } while (pOVar11 != pOVar13);
  }
  local_50 = pOVar13;
  DisposeOutPts(&local_50);
  pOVar13 = (OutPt *)0x0;
LAB_002db5ea:
  outrec->Pts = pOVar13;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outrec)
{
    //FixupOutPolygon() - removes duplicate points and simplifies consecutive
    //parallel edges by removing the middle vertex.
    OutPt *lastOK = 0;
    outrec.BottomPt = 0;
    OutPt *pp = outrec.Pts;
    bool preserveCol = m_PreserveCollinear || m_StrictSimple;

    for (;;)
    {
        if (pp->Prev == pp || pp->Prev == pp->Next)
        {
            DisposeOutPts(pp);
            outrec.Pts = 0;
            return;
        }

        //test for duplicate points and collinear edges ...
        if ((pp->Pt == pp->Next->Pt) || (pp->Pt == pp->Prev->Pt) ||
            (SlopesEqual(pp->Prev->Pt, pp->Pt, pp->Next->Pt, m_UseFullRange) &&
            (!preserveCol || !Pt2IsBetweenPt1AndPt3(pp->Prev->Pt, pp->Pt, pp->Next->Pt))))
        {
            lastOK = 0;
            OutPt *tmp = pp;
            pp->Prev->Next = pp->Next;
            pp->Next->Prev = pp->Prev;
            pp = pp->Prev;
            delete tmp;
        }
        else if (pp == lastOK) break;
        else
        {
            if (!lastOK) lastOK = pp;
            pp = pp->Next;
        }
    }
    outrec.Pts = pp;
}